

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

wchar_t breakage_chance(object *obj,_Bool hit_target)

{
  _Bool _Var1;
  wchar_t wVar2;
  
  wVar2 = L'\0';
  if (obj->artifact == (artifact *)0x0) {
    wVar2 = obj->kind->base->break_perc;
    _Var1 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
    if (_Var1) {
      _Var1 = flag_has_dbg(obj->flags,6,0x27,"obj->flags","OF_EXPLODE");
      if (!_Var1) {
        _Var1 = tval_is_ammo(obj);
        if (!_Var1) {
          wVar2 = L'\x01';
        }
      }
    }
    if (!hit_target) {
      wVar2 = (uint)(wVar2 * wVar2) / 100;
    }
  }
  return wVar2;
}

Assistant:

int breakage_chance(const struct object *obj, bool hit_target) {
	int perc = obj->kind->base->break_perc;

	if (obj->artifact) return 0;
	if (of_has(obj->flags, OF_THROWING) &&
		!of_has(obj->flags, OF_EXPLODE) &&
		!tval_is_ammo(obj)) {
		perc = 1;
	}
	if (!hit_target) return (perc * perc) / 100;
	return perc;
}